

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mod.c
# Opt level: O2

int BN_mod_lshift(BIGNUM *r,BIGNUM *a,int n,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *a_00;
  
  iVar1 = BN_nnmod(r,a,m,ctx);
  if (iVar1 == 0) {
LAB_001126b4:
    iVar1 = 0;
  }
  else {
    if (m->neg == 0) {
      a_00 = (BIGNUM *)0x0;
    }
    else {
      a_00 = BN_dup(m);
      if (a_00 == (BIGNUM *)0x0) goto LAB_001126b4;
      a_00->neg = 0;
    }
    if (a_00 != (BIGNUM *)0x0) {
      m = a_00;
    }
    iVar1 = BN_mod_lshift_quick(r,r,n,m);
    BN_free(a_00);
  }
  return iVar1;
}

Assistant:

int BN_mod_lshift(BIGNUM *r, const BIGNUM *a, int n, const BIGNUM *m,
                  BN_CTX *ctx)
{
    BIGNUM *abs_m = NULL;
    int ret;

    if (!BN_nnmod(r, a, m, ctx))
        return 0;

    if (m->neg) {
        abs_m = BN_dup(m);
        if (abs_m == NULL)
            return 0;
        abs_m->neg = 0;
    }

    ret = BN_mod_lshift_quick(r, r, n, (abs_m ? abs_m : m));
    bn_check_top(r);

    BN_free(abs_m);
    return ret;
}